

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prov_custom_hsm.c
# Opt level: O0

int prov_custom_hsm_get_endorsement_key(HSM_CLIENT_HANDLE handle,uchar **key,size_t *key_len)

{
  uchar *puVar1;
  CUSTOM_HSM_SAMPLE_INFO *hsm_info;
  int result;
  size_t *key_len_local;
  uchar **key_local;
  HSM_CLIENT_HANDLE handle_local;
  
  if (((handle == (HSM_CLIENT_HANDLE)0x0) || (key == (uchar **)0x0)) || (key_len == (size_t *)0x0))
  {
    printf("Invalid parameter specified");
    hsm_info._4_4_ = 0xba;
  }
  else {
    puVar1 = (uchar *)malloc(*(size_t *)((long)handle + 0x20));
    *key = puVar1;
    if (puVar1 == (uchar *)0x0) {
      printf("Failure allocating endorsement key\r\n");
      hsm_info._4_4_ = 0xc4;
    }
    else {
      memcpy(*key,*(void **)((long)handle + 0x18),*(size_t *)((long)handle + 0x20));
      *key_len = *(size_t *)((long)handle + 0x20);
      hsm_info._4_4_ = 0;
    }
  }
  return hsm_info._4_4_;
}

Assistant:

int prov_custom_hsm_get_endorsement_key(HSM_CLIENT_HANDLE handle, unsigned char** key, size_t* key_len)
{
    int result;
    if (handle == NULL || key == NULL || key_len == NULL)
    {
        (void)printf("Invalid parameter specified");
        result = __LINE__;
    }
    else
    {
        // TODO: Retrieve the endorsement key and malloc the value and return
        // it to the sdk
        CUSTOM_HSM_SAMPLE_INFO* hsm_info = (CUSTOM_HSM_SAMPLE_INFO*)handle;
        if ((*key = (unsigned char*)malloc(hsm_info->ek_length)) == NULL)
        {
            (void)printf("Failure allocating endorsement key\r\n");
            result = __LINE__;
        }
        else
        {
            memcpy(*key, hsm_info->endorsment_key, hsm_info->ek_length);
            *key_len = hsm_info->ek_length;
            result = 0;
        }
    }
    return result;
}